

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Schema __thiscall capnp::SchemaLoader::loadOnce(SchemaLoader *this,Reader *reader)

{
  Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> locked;
  TryGetResult getResult;
  Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> local_30;
  RawSchema *local_20;
  
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)&local_30,this);
  Impl::tryGet((Impl *)&stack0xffffffffffffffe0,(uint64_t)(local_30.ptr)->ptr);
  if ((local_20 == (RawSchema *)0x0) || (local_20->lazyInitializer != (Initializer *)0x0)) {
    local_20 = Impl::load((local_30.ptr)->ptr,reader,false);
  }
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked(&local_30);
  return (Schema)&local_20->defaultBrand;
}

Assistant:

Schema SchemaLoader::loadOnce(const schema::Node::Reader& reader) const {
  auto locked = impl.lockExclusive();
  auto getResult = locked->get()->tryGet(reader.getId());
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // Doesn't exist yet, or the existing schema is a placeholder and therefore has not yet been
    // seen publicly.  Go ahead and load the incoming reader.
    return Schema(&locked->get()->load(reader, false)->defaultBrand);
  } else {
    return Schema(&getResult.schema->defaultBrand);
  }
}